

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.h
# Opt level: O2

void __thiscall CMU462::Ray::Ray(Ray *this,Vector3D *o,Vector3D *d,int depth)

{
  double dVar1;
  undefined1 auVar2 [16];
  
  this->depth = (long)depth;
  dVar1 = o->y;
  (this->o).x = o->x;
  (this->o).y = dVar1;
  (this->o).z = o->z;
  dVar1 = d->y;
  (this->d).x = d->x;
  (this->d).y = dVar1;
  (this->d).z = d->z;
  *(undefined4 *)&this->min_t = 0;
  *(undefined4 *)((long)&this->min_t + 4) = 0;
  *(undefined4 *)&this->max_t = 0;
  *(undefined4 *)((long)&this->max_t + 4) = 0x7ff00000;
  (this->inv_d).x = 0.0;
  (this->inv_d).y = 0.0;
  (this->inv_d).z = 0.0;
  dVar1 = 1.0 / d->z;
  auVar2._0_8_ = d->x;
  auVar2._8_8_ = d->y;
  auVar2 = divpd(_DAT_001e5bf0,auVar2);
  (this->inv_d).x = (double)auVar2._0_8_;
  (this->inv_d).y = (double)auVar2._8_8_;
  (this->inv_d).z = dVar1;
  *(ulong *)this->sign =
       CONCAT44(-(uint)(auVar2._8_8_ < 0.0),-(uint)(auVar2._0_8_ < 0.0)) & 0x100000001;
  this->sign[2] = (uint)(dVar1 < 0.0);
  return;
}

Assistant:

Ray(const Vector3D& o, const Vector3D& d, int depth = 0)
      : o(o), d(d), min_t(0.0), max_t(INF_D), depth(depth) {
        inv_d = Vector3D(1 / d.x, 1 / d.y, 1 / d.z);
        sign[0] = (inv_d.x < 0);
        sign[1] = (inv_d.y < 0);
        sign[2] = (inv_d.z < 0);
      }